

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pricing_session.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::PricingSession::OnProviderStatusUpdate
          (PricingSession *this,shared_ptr<bidfx_public_api::ProviderStatusEvent> *event)

{
  bool bVar1;
  int iVar2;
  Status SVar3;
  element_type *peVar4;
  undefined4 extraout_var;
  reference __x;
  exception *e;
  undefined1 local_50 [8];
  function<void_(std::shared_ptr<bidfx_public_api::ProviderStatusEvent>)> callback;
  iterator __end2;
  iterator __begin2;
  vector<std::function<void_(std::shared_ptr<bidfx_public_api::ProviderStatusEvent>)>,_std::allocator<std::function<void_(std::shared_ptr<bidfx_public_api::ProviderStatusEvent>)>_>_>
  *__range2;
  shared_ptr<bidfx_public_api::ProviderStatusEvent> *event_local;
  PricingSession *this_local;
  
  bVar1 = std::atomic::operator_cast_to_bool((atomic *)&this->running_);
  if (bVar1) {
    peVar4 = std::
             __shared_ptr_access<bidfx_public_api::ProviderStatusEvent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<bidfx_public_api::ProviderStatusEvent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)event);
    iVar2 = (**peVar4->_vptr_ProviderStatusEvent)();
    SVar3 = provider::ProviderProperties::GetStatus
                      ((ProviderProperties *)CONCAT44(extraout_var,iVar2));
    if (SVar3 == READY) {
      ResubscribeToAllOn(this,this->pixie_provider_);
    }
    __end2 = std::
             vector<std::function<void_(std::shared_ptr<bidfx_public_api::ProviderStatusEvent>)>,_std::allocator<std::function<void_(std::shared_ptr<bidfx_public_api::ProviderStatusEvent>)>_>_>
             ::begin(&this->provider_status_update_callback_);
    callback._M_invoker =
         (_Invoker_type)
         std::
         vector<std::function<void_(std::shared_ptr<bidfx_public_api::ProviderStatusEvent>)>,_std::allocator<std::function<void_(std::shared_ptr<bidfx_public_api::ProviderStatusEvent>)>_>_>
         ::end(&this->provider_status_update_callback_);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::function<void_(std::shared_ptr<bidfx_public_api::ProviderStatusEvent>)>_*,_std::vector<std::function<void_(std::shared_ptr<bidfx_public_api::ProviderStatusEvent>)>,_std::allocator<std::function<void_(std::shared_ptr<bidfx_public_api::ProviderStatusEvent>)>_>_>_>
                                       *)&callback._M_invoker), bVar1) {
      __x = __gnu_cxx::
            __normal_iterator<std::function<void_(std::shared_ptr<bidfx_public_api::ProviderStatusEvent>)>_*,_std::vector<std::function<void_(std::shared_ptr<bidfx_public_api::ProviderStatusEvent>)>,_std::allocator<std::function<void_(std::shared_ptr<bidfx_public_api::ProviderStatusEvent>)>_>_>_>
            ::operator*(&__end2);
      std::function<void_(std::shared_ptr<bidfx_public_api::ProviderStatusEvent>)>::function
                ((function<void_(std::shared_ptr<bidfx_public_api::ProviderStatusEvent>)> *)local_50
                 ,__x);
      std::shared_ptr<bidfx_public_api::ProviderStatusEvent>::shared_ptr
                ((shared_ptr<bidfx_public_api::ProviderStatusEvent> *)&e,event);
      std::function<void_(std::shared_ptr<bidfx_public_api::ProviderStatusEvent>)>::operator()
                ((function<void_(std::shared_ptr<bidfx_public_api::ProviderStatusEvent>)> *)local_50
                 ,(shared_ptr<bidfx_public_api::ProviderStatusEvent> *)&e);
      std::shared_ptr<bidfx_public_api::ProviderStatusEvent>::~shared_ptr
                ((shared_ptr<bidfx_public_api::ProviderStatusEvent> *)&e);
      std::function<void_(std::shared_ptr<bidfx_public_api::ProviderStatusEvent>)>::~function
                ((function<void_(std::shared_ptr<bidfx_public_api::ProviderStatusEvent>)> *)local_50
                );
      __gnu_cxx::
      __normal_iterator<std::function<void_(std::shared_ptr<bidfx_public_api::ProviderStatusEvent>)>_*,_std::vector<std::function<void_(std::shared_ptr<bidfx_public_api::ProviderStatusEvent>)>,_std::allocator<std::function<void_(std::shared_ptr<bidfx_public_api::ProviderStatusEvent>)>_>_>_>
      ::operator++(&__end2);
    }
  }
  return;
}

Assistant:

void PricingSession::OnProviderStatusUpdate(std::shared_ptr<ProviderStatusEvent> event)
{
    if (!running_)
    {
        return;
    }
    if (event->GetProviderProperties().GetStatus() == Provider::Status::READY)
    {
        ResubscribeToAllOn(pixie_provider_);
    }

    try
    {
        for (auto callback : provider_status_update_callback_)
        {
            callback(event);
        }
    }
    catch (std::exception &e)
    {
        Log->warn("error handling provider status {}", e.what());
        throw e;
    }
}